

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_radix_scatter.cpp
# Opt level: O0

void duckdb::RadixScatterStringVector
               (UnifiedVectorFormat *vdata,SelectionVector *sel,idx_t add_count,
               data_ptr_t *key_locations,bool desc,bool has_null,bool nulls_first,idx_t prefix_len,
               idx_t offset)

{
  string_t value;
  bool bVar1;
  string_t *psVar2;
  idx_t idx_00;
  idx_t iVar3;
  idx_t in_RCX;
  TemplatedValidityMask<unsigned_long> *in_RDX;
  SelectionVector *in_RSI;
  UnifiedVectorFormat *in_RDI;
  byte in_R8B;
  byte in_R9B;
  bool bVar4;
  byte in_stack_00000008;
  data_ptr_t in_stack_00000010;
  idx_t s_1;
  idx_t source_idx_1;
  idx_t idx_1;
  idx_t i_1;
  idx_t s;
  idx_t source_idx;
  idx_t idx;
  idx_t i;
  data_t invalid;
  data_t valid;
  ValidityMask *validity;
  string_t *source;
  TemplatedValidityMask<unsigned_long> *this;
  data_ptr_t in_stack_ffffffffffffff60;
  undefined8 in_stack_ffffffffffffff68;
  undefined8 in_stack_ffffffffffffff70;
  TemplatedValidityMask<unsigned_long> *local_78;
  data_ptr_t local_70;
  TemplatedValidityMask<unsigned_long> *local_48;
  
  iVar3 = in_RCX;
  this = in_RDX;
  psVar2 = UnifiedVectorFormat::GetData<duckdb::string_t>(in_RDI);
  if ((in_R9B & 1) == 0) {
    for (local_78 = (TemplatedValidityMask<unsigned_long> *)0x0; local_78 < in_RDX;
        local_78 = (TemplatedValidityMask<unsigned_long> *)((long)&local_78->validity_mask + 1)) {
      iVar3 = SelectionVector::get_index(in_RSI,(idx_t)local_78);
      iVar3 = SelectionVector::get_index(in_RDI->sel,iVar3);
      Radix::EncodeStringDataPrefix
                (in_stack_ffffffffffffff60,(string_t)psVar2[iVar3 + s_1].value.pointer,(idx_t)this);
      if ((in_R8B & 1) != 0) {
        for (in_stack_ffffffffffffff60 = (data_ptr_t)0x0;
            in_stack_ffffffffffffff60 < in_stack_00000010;
            in_stack_ffffffffffffff60 = in_stack_ffffffffffffff60 + 1) {
          in_stack_ffffffffffffff60[*(long *)(in_RCX + (long)local_78 * 8)] =
               in_stack_ffffffffffffff60[*(long *)(in_RCX + (long)local_78 * 8)] ^ 0xff;
        }
      }
      *(data_ptr_t *)(in_RCX + (long)local_78 * 8) =
           in_stack_00000010 + *(long *)(in_RCX + (long)local_78 * 8);
    }
  }
  else {
    bVar4 = (in_stack_00000008 & 1) != 0;
    for (local_48 = (TemplatedValidityMask<unsigned_long> *)0x0; local_48 < in_RDX;
        local_48 = (TemplatedValidityMask<unsigned_long> *)((long)&local_48->validity_mask + 1)) {
      idx_00 = SelectionVector::get_index(in_RSI,(idx_t)local_48);
      SelectionVector::get_index(in_RDI->sel,idx_00);
      bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid(this,iVar3);
      if (bVar1) {
        *(bool *)*(undefined8 *)(in_RCX + (long)local_48 * 8) = bVar4;
        value.value.pointer.ptr = (char *)in_stack_ffffffffffffff70;
        value.value._0_8_ = in_stack_ffffffffffffff68;
        Radix::EncodeStringDataPrefix(in_stack_ffffffffffffff60,value,(idx_t)this);
        if ((in_R8B & 1) != 0) {
          for (local_70 = (data_ptr_t)0x1; local_70 < in_stack_00000010 + 1; local_70 = local_70 + 1
              ) {
            local_70[*(long *)(in_RCX + (long)local_48 * 8)] =
                 local_70[*(long *)(in_RCX + (long)local_48 * 8)] ^ 0xff;
          }
        }
      }
      else {
        **(char **)(in_RCX + (long)local_48 * 8) = '\x01' - bVar4;
        memset((void *)(*(long *)(in_RCX + (long)local_48 * 8) + 1),0,(size_t)in_stack_00000010);
      }
      *(data_ptr_t *)(in_RCX + (long)local_48 * 8) =
           in_stack_00000010 + *(long *)(in_RCX + (long)local_48 * 8) + 1;
    }
  }
  return;
}

Assistant:

void RadixScatterStringVector(UnifiedVectorFormat &vdata, const SelectionVector &sel, idx_t add_count,
                              data_ptr_t *key_locations, const bool desc, const bool has_null, const bool nulls_first,
                              const idx_t prefix_len, idx_t offset) {
	auto source = UnifiedVectorFormat::GetData<string_t>(vdata);
	if (has_null) {
		auto &validity = vdata.validity;
		const data_t valid = nulls_first ? 1 : 0;
		const data_t invalid = 1 - valid;

		for (idx_t i = 0; i < add_count; i++) {
			auto idx = sel.get_index(i);
			auto source_idx = vdata.sel->get_index(idx) + offset;
			// write validity and according value
			if (validity.RowIsValid(source_idx)) {
				key_locations[i][0] = valid;
				Radix::EncodeStringDataPrefix(key_locations[i] + 1, source[source_idx], prefix_len);
				// invert bits if desc
				if (desc) {
					for (idx_t s = 1; s < prefix_len + 1; s++) {
						*(key_locations[i] + s) = ~*(key_locations[i] + s);
					}
				}
			} else {
				key_locations[i][0] = invalid;
				memset(key_locations[i] + 1, '\0', prefix_len);
			}
			key_locations[i] += prefix_len + 1;
		}
	} else {
		for (idx_t i = 0; i < add_count; i++) {
			auto idx = sel.get_index(i);
			auto source_idx = vdata.sel->get_index(idx) + offset;
			// write value
			Radix::EncodeStringDataPrefix(key_locations[i], source[source_idx], prefix_len);
			// invert bits if desc
			if (desc) {
				for (idx_t s = 0; s < prefix_len; s++) {
					*(key_locations[i] + s) = ~*(key_locations[i] + s);
				}
			}
			key_locations[i] += prefix_len;
		}
	}
}